

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

void FunctionalTester<short,_void>::Test(void)

{
  short x;
  pointer pvVar1;
  pointer str2;
  short *arg;
  undefined1 local_9c [8];
  buf_t buf2;
  short local_50 [3];
  undefined1 local_49;
  short i;
  short imax;
  short imin;
  buf_t buf1;
  TestWatcher<short> tw;
  
  TestWatcher<short>::TestWatcher((TestWatcher<short> *)(buf1._M_elems + 0x38));
  local_50[2] = 0x8000;
  local_50[1] = 0x7fff;
  for (local_50[0] = -0x8000; x = local_50[0], local_50[0] < 0x7fff; local_50[0] = local_50[0] + 1)
  {
    pvVar1 = std::array<char,_64UL>::data((array<char,_64UL> *)&local_49);
    int2str::convert_with_zero<short,char*>(x,pvVar1);
    boost::lexical_cast<std::array<char,64ul>,short>
              ((array<char,_64UL> *)local_9c,(boost *)local_50,arg);
    pvVar1 = std::array<char,_64UL>::data((array<char,_64UL> *)&local_49);
    str2 = std::array<char,_64UL>::data((array<char,_64UL> *)local_9c);
    StrcmpAndExit(pvVar1,str2);
  }
  TestWatcher<short>::~TestWatcher((TestWatcher<short> *)(buf1._M_elems + 0x38));
  return;
}

Assistant:

static void Test()
    {
        TestWatcher<T> const tw;
        typedef std::array<char, 64> buf_t;
        buf_t buf1;
        T const imin = std::numeric_limits<T>::min();
        T const imax = std::numeric_limits<T>::max();
        for (T i = imin; i < imax; ++i)
        {
            int2str::convert_with_zero(i, buf1.data());
#ifdef USE_BOOST
            buf_t buf2 = boost::lexical_cast<buf_t>(i);
#else
            buf_t buf2;
            sprintf(buf2.data(), PrintfFormat<T>(), i);
#endif
            StrcmpAndExit(buf1.data(), buf2.data());
        }
    }